

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_dict_deflate(Byte *compr,uLong comprLen)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcStack_88;
  int err;
  z_stream c_stream;
  uLong comprLen_local;
  Byte *compr_local;
  
  c_stream.state = (internal_state *)zalloc;
  c_stream.zalloc = (alloc_func)zfree;
  c_stream.zfree = (free_func)0x0;
  c_stream.reserved = comprLen;
  uVar1 = deflateInit_(&stack0xffffffffffffff78,9,"1.2.8",0x70);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflateInit",(ulong)uVar1);
    exit(1);
  }
  uVar1 = deflateSetDictionary(&stack0xffffffffffffff78,"hello",6);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflateSetDictionary",(ulong)uVar1);
    exit(1);
  }
  dictId = c_stream._88_8_;
  c_stream.next_out._0_4_ = (undefined4)c_stream.reserved;
  pcStack_88 = hello;
  c_stream.total_in = (uLong)compr;
  sVar3 = strlen(hello);
  c_stream.next_in._0_4_ = (int)sVar3 + 1;
  iVar2 = deflate(&stack0xffffffffffffff78,4);
  if (iVar2 != 1) {
    fprintf(_stderr,"deflate should report Z_STREAM_END\n");
    exit(1);
  }
  uVar1 = deflateEnd(&stack0xffffffffffffff78);
  if (uVar1 != 0) {
    fprintf(_stderr,"%s error: %d\n","deflateEnd",(ulong)uVar1);
    exit(1);
  }
  return;
}

Assistant:

void test_dict_deflate(compr, comprLen)
    Byte *compr;
    uLong comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_BEST_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    err = deflateSetDictionary(&c_stream,
                (const Bytef*)dictionary, (int)sizeof(dictionary));
    CHECK_ERR(err, "deflateSetDictionary");

    dictId = c_stream.adler;
    c_stream.next_out = compr;
    c_stream.avail_out = (uInt)comprLen;

    c_stream.next_in = (z_const unsigned char *)hello;
    c_stream.avail_in = (uInt)strlen(hello)+1;

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        fprintf(stderr, "deflate should report Z_STREAM_END\n");
        exit(1);
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");
}